

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,measurement *measure,uint64_t match_flags)

{
  byte bVar1;
  string str;
  undefined8 local_1b0;
  stringstream ss;
  undefined8 uStack_1a0;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(undefined8 *)((long)&uStack_1a0 + *(long *)(_ss + -0x18)) = 6;
  std::ostream::_M_insert<double>(*(double *)this);
  local_1b0 = *(undefined8 *)(this + 8);
  to_string_abi_cxx11_(&str,(units *)&local_1b0,(unit *)measure,match_flags);
  if (str._M_string_length != 0) {
    std::operator<<(local_198,' ');
    bVar1 = *str._M_dataplus._M_p;
    if (((byte)(bVar1 - 0x30) < 10) ||
       ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))) {
      std::__cxx11::string::insert(&str,str._M_dataplus._M_p,0x28);
      std::__cxx11::string::push_back((char)&str);
    }
    std::operator<<(local_198,(string *)&str);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const measurement& measure, std::uint64_t match_flags)
{
    std::stringstream ss;
    ss.precision(6);
    ss << measure.value();

    auto str = to_string(measure.units(), match_flags);
    if (!str.empty()) {
        ss << ' ';
        if (isNumericalStartCharacter(str.front())) {
            str.insert(str.begin(), '(');
            str.push_back(')');
        }
        ss << str;
    }
    return ss.str();
}